

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sampleIsBetter(Stat4Accum *pAccum,Stat4Sample *pNew,Stat4Sample *pOld)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = pNew->iCol;
  lVar6 = (long)iVar1;
  uVar2 = pNew->anEq[lVar6];
  iVar3 = pOld->iCol;
  uVar4 = pOld->anEq[iVar3];
  iVar5 = 1;
  if (uVar2 <= uVar4) {
    if (uVar2 == uVar4) {
      if (iVar1 < iVar3) {
        return 1;
      }
      if (iVar1 == iVar3) {
        do {
          lVar6 = lVar6 + 1;
          if (pAccum->nCol <= lVar6) {
            return (uint)(pOld->iHash < pNew->iHash);
          }
          uVar2 = pNew->anEq[lVar6];
          uVar4 = pOld->anEq[lVar6];
          if (uVar4 < uVar2) {
            return 1;
          }
        } while (uVar4 <= uVar2);
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int sampleIsBetter(
  Stat4Accum *pAccum, 
  Stat4Sample *pNew, 
  Stat4Sample *pOld
){
  tRowcnt nEqNew = pNew->anEq[pNew->iCol];
  tRowcnt nEqOld = pOld->anEq[pOld->iCol];

  assert( pOld->isPSample==0 && pNew->isPSample==0 );
  assert( IsStat4 || (pNew->iCol==0 && pOld->iCol==0) );

  if( (nEqNew>nEqOld) ) return 1;
#ifdef SQLITE_ENABLE_STAT4
  if( nEqNew==nEqOld ){
    if( pNew->iCol<pOld->iCol ) return 1;
    return (pNew->iCol==pOld->iCol && sampleIsBetterPost(pAccum, pNew, pOld));
  }
  return 0;
#else
  return (nEqNew==nEqOld && pNew->iHash>pOld->iHash);
#endif
}